

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:506:11)>
::getImpl(SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:506:11)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<unsigned_long> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2 local_368;
  ExceptionOr<kj::Promise<kj::String>_> local_360;
  NullableValue<kj::Exception> local_1b8;
  char local_20;
  
  local_1b8.isSet = false;
  local_20 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_1b8);
  if (local_1b8.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_360,&local_1b8.field_1.value);
    local_360.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<kj::String>_>::operator=
              ((ExceptionOr<kj::Promise<kj::String>_> *)output,&local_360);
    ExceptionOr<kj::Promise<kj::String>_>::~ExceptionOr(&local_360);
  }
  else if (local_20 == '\x01') {
    anon_class_16_2_5e707987_for_func::operator()
              ((anon_class_16_2_5e707987_for_func *)&local_368.value,(size_t)&this->func);
    local_360.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_360.value.ptr.isSet = true;
    local_360.value.ptr.field_1 = local_368;
    local_368 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2)0x0;
    ExceptionOr<kj::Promise<kj::String>_>::operator=
              ((ExceptionOr<kj::Promise<kj::String>_> *)output,&local_360);
    ExceptionOr<kj::Promise<kj::String>_>::~ExceptionOr(&local_360);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_368.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_1b8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }